

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O1

Own<capnp::ClientHook> capnp::anon_unknown_0::newNullCap(void)

{
  uint *puVar1;
  BrokenClient *this;
  ClientHook *extraout_RDX;
  Disposer *in_RDI;
  StringPtr description;
  Own<capnp::ClientHook> OVar2;
  
  this = (BrokenClient *)operator_new(0x180);
  description.content.size_ = 0x18;
  description.content.ptr = "Called null capability.";
  BrokenClient::BrokenClient(this,description,true,&ClientHook::NULL_CAPABILITY_BRAND);
  puVar1 = &(this->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  in_RDI->_vptr_Disposer = (_func_int **)&this->super_Refcounted;
  in_RDI[1]._vptr_Disposer = (_func_int **)this;
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = in_RDI;
  return OVar2;
}

Assistant:

kj::Own<ClientHook> newNullCap() {
  // A null capability, unlike other broken capabilities, is considered resolved.
  return kj::refcounted<BrokenClient>("Called null capability.", true,
                                      &ClientHook::NULL_CAPABILITY_BRAND);
}